

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grparser.c
# Opt level: O1

int ngp_include_file(char *fname)

{
  FILE *pFVar1;
  char *pcVar2;
  size_t sVar3;
  size_t sVar4;
  char *__dest;
  int iVar5;
  char envfiles [10000];
  char acStack_2748 [9999];
  undefined1 local_39;
  
  if (fname == (char *)0x0) {
    iVar5 = 0x16a;
  }
  else {
    iVar5 = 0x16d;
    if (ngp_inclevel < 10) {
      pFVar1 = fopen(fname,"r");
      ngp_fp[ngp_inclevel] = (FILE *)pFVar1;
      if (pFVar1 == (FILE *)0x0) {
        pcVar2 = getenv("CFITSIO_INCLUDE_FILES");
        if (pcVar2 != (char *)0x0) {
          strncpy(acStack_2748,pcVar2,9999);
          local_39 = 0;
          pcVar2 = strtok(acStack_2748,":");
          while (pcVar2 != (char *)0x0) {
            sVar3 = strlen(fname);
            sVar4 = strlen(pcVar2);
            __dest = (char *)malloc(sVar4 + sVar3 + 2);
            if (__dest == (char *)0x0) {
              return 0x168;
            }
            strcpy(__dest,pcVar2);
            sVar3 = strlen(__dest);
            (__dest + sVar3)[0] = '/';
            (__dest + sVar3)[1] = '\0';
            strcat(__dest,fname);
            pFVar1 = fopen(__dest,"r");
            ngp_fp[ngp_inclevel] = (FILE *)pFVar1;
            free(__dest);
            if (pFVar1 != (FILE *)0x0) break;
            pcVar2 = strtok((char *)0x0,":");
          }
        }
        if (ngp_fp[ngp_inclevel] == (FILE *)0x0) {
          if (*fname == '/') {
            return 0x16e;
          }
          if (ngp_master_dir[0] == '\0') {
            return 0x16e;
          }
          sVar3 = strlen(fname);
          sVar4 = strlen(ngp_master_dir);
          pcVar2 = (char *)malloc(sVar3 + sVar4 + 1);
          if (pcVar2 == (char *)0x0) {
            return 0x168;
          }
          strcpy(pcVar2,ngp_master_dir);
          strcat(pcVar2,fname);
          pFVar1 = fopen(pcVar2,"r");
          ngp_fp[ngp_inclevel] = (FILE *)pFVar1;
          free(pcVar2);
          if (pFVar1 == (FILE *)0x0) {
            return 0x16e;
          }
        }
      }
      ngp_inclevel = ngp_inclevel + 1;
      iVar5 = 0;
    }
  }
  return iVar5;
}

Assistant:

int	ngp_include_file(char *fname)		/* try to open include file */
 { char *p, *p2, *cp, *envar, envfiles[NGP_MAX_ENVFILES];
   char *saveptr;

   if (NULL == fname) return(NGP_NUL_PTR);

   if (ngp_inclevel >= NGP_MAX_INCLUDE)		/* too many include files */
     return(NGP_INC_NESTING);

   if (NULL == (ngp_fp[ngp_inclevel] = fopen(fname, "r")))
     {                                          /* if simple open failed .. */
       envar = getenv("CFITSIO_INCLUDE_FILES");	/* scan env. variable, and retry to open */

       if (NULL != envar)			/* is env. variable defined ? */
         { strncpy(envfiles, envar, NGP_MAX_ENVFILES - 1);
           envfiles[NGP_MAX_ENVFILES - 1] = 0;	/* copy search path to local variable, env. is fragile */

           for (p2 = ffstrtok(envfiles, ":",&saveptr); NULL != p2; p2 = ffstrtok(NULL, ":",&saveptr))
            {
	      cp = (char *)ngp_alloc(strlen(fname) + strlen(p2) + 2);
	      if (NULL == cp) return(NGP_NO_MEMORY);

	      strcpy(cp, p2);
#ifdef  MSDOS
              strcat(cp, "\\");			/* abs. pathname for MSDOS */
               
#else
              strcat(cp, "/");			/* and for unix */
#endif
	      strcat(cp, fname);
	  
	      ngp_fp[ngp_inclevel] = fopen(cp, "r");
	      ngp_free(cp);

	      if (NULL != ngp_fp[ngp_inclevel]) break;
	    }
        }
                                      
       if (NULL == ngp_fp[ngp_inclevel])	/* finally try to open relative to top level */
         {
#ifdef  MSDOS
           if ('\\' == fname[0]) return(NGP_ERR_FOPEN); /* abs. pathname for MSDOS, does not support C:\\PATH */
#else
           if ('/' == fname[0]) return(NGP_ERR_FOPEN); /* and for unix */
#endif
           if (0 == ngp_master_dir[0]) return(NGP_ERR_FOPEN);

	   p = ngp_alloc(strlen(fname) + strlen(ngp_master_dir) + 1);
           if (NULL == p) return(NGP_NO_MEMORY);

           strcpy(p, ngp_master_dir);		/* construct composite pathname */
           strcat(p, fname);			/* comp = master + fname */

           ngp_fp[ngp_inclevel] = fopen(p, "r");/* try to open composite */
           ngp_free(p);				/* we don't need buffer anymore */

           if (NULL == ngp_fp[ngp_inclevel])
             return(NGP_ERR_FOPEN);		/* fail if error */
         }
     }

   ngp_inclevel++;
   return(NGP_OK);
 }